

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O0

_Bool lzma_lzma_lclppb_decode(lzma_options_lzma *options,uint8_t byte)

{
  byte bVar1;
  uint8_t byte_local;
  lzma_options_lzma *options_local;
  
  if (byte < 0xe1) {
    options->pb = byte / 0x2d;
    bVar1 = byte + (char)options->pb * -0x2d;
    options->lp = bVar1 / 9;
    options->lc = (uint)bVar1 + options->lp * -9;
    options_local._7_1_ = 4 < options->lc + options->lp;
  }
  else {
    options_local._7_1_ = true;
  }
  return options_local._7_1_;
}

Assistant:

extern bool
lzma_lzma_lclppb_decode(lzma_options_lzma *options, uint8_t byte)
{
	if (byte > (4 * 5 + 4) * 9 + 8)
		return true;

	// See the file format specification to understand this.
	options->pb = byte / (9 * 5);
	byte -= options->pb * 9 * 5;
	options->lp = byte / 9;
	options->lc = byte - options->lp * 9;

	return options->lc + options->lp > LZMA_LCLP_MAX;
}